

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void fl_init_workarea(void)

{
  int iVar1;
  int *local_38;
  int format;
  unsigned_long remaining;
  unsigned_long count;
  Atom actual;
  
  fl_open_display();
  local_38 = (int *)0x0;
  iVar1 = Fl::screen_count();
  if ((((iVar1 < 2) &&
       (iVar1 = XGetWindowProperty(fl_display,
                                   *(undefined8 *)
                                    (*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),
                                   fl_NET_WORKAREA,0,4,0,6,&actual,&format,&count,&remaining,
                                   &local_38), local_38 != (int *)0x0 && iVar1 == 0)) &&
      (*(long *)(local_38 + 4) != 0)) && (*(long *)(local_38 + 6) != 0)) {
    fl_workarea_xywh[1] = local_38[2];
    fl_workarea_xywh[0] = *local_38;
    fl_workarea_xywh[2] = (int)*(long *)(local_38 + 4);
    fl_workarea_xywh[3] = (int)*(long *)(local_38 + 6);
  }
  else {
    Fl::screen_xywh(fl_workarea_xywh,fl_workarea_xywh + 1,fl_workarea_xywh + 2,fl_workarea_xywh + 3,
                    0);
    if (local_38 == (int *)0x0) {
      return;
    }
  }
  XFree();
  return;
}

Assistant:

static void fl_init_workarea() {
  fl_open_display();

  Atom actual;
  unsigned long count, remaining;
  int format;
  long *xywh = 0;

  /* If there are several screens, the _NET_WORKAREA property 
   does not give the work area of the main screen, but that of all screens together.
   Therefore, we use this property only when there is a single screen,
   and fall back to the main screen full area when there are several screens.
   */
  if (Fl::screen_count() > 1 || XGetWindowProperty(fl_display, RootWindow(fl_display, fl_screen),
			 fl_NET_WORKAREA, 0, 4, False,
                         XA_CARDINAL, &actual, &format, &count, &remaining,
                         (unsigned char **)&xywh) || !xywh || !xywh[2] ||
                         !xywh[3])
  {
    Fl::screen_xywh(fl_workarea_xywh[0], 
		    fl_workarea_xywh[1], 
		    fl_workarea_xywh[2], 
		    fl_workarea_xywh[3], 0);
  }
  else
  {
    fl_workarea_xywh[0] = (int)xywh[0];
    fl_workarea_xywh[1] = (int)xywh[1];
    fl_workarea_xywh[2] = (int)xywh[2];
    fl_workarea_xywh[3] = (int)xywh[3];
  }
  if ( xywh ) { XFree(xywh); xywh = 0; }
}